

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_unsigned_long_&,_const_long_long_&> * __thiscall
Catch::ExprLhs<unsigned_long_const&>::operator>(ExprLhs<const_unsigned_long_&> *this,longlong *rhs)

{
  ulong *in_RDX;
  undefined8 *in_RSI;
  BinaryExpr<const_unsigned_long_&,_const_long_long_&> *in_RDI;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar1;
  char *rawChars;
  BinaryExpr<const_unsigned_long_&,_const_long_long_&> *this_00;
  StringRef in_stack_ffffffffffffffd8;
  
  uVar1 = *in_RDX < *(ulong *)*in_RSI;
  rawChars = (char *)*in_RSI;
  this_00 = in_RDI;
  StringRef::StringRef((StringRef *)in_RDI,rawChars);
  BinaryExpr<const_unsigned_long_&,_const_long_long_&>::BinaryExpr
            (this_00,SUB81((ulong)rawChars >> 0x38,0),(unsigned_long *)in_RDI,
             in_stack_ffffffffffffffd8,(longlong *)CONCAT17(uVar1,in_stack_ffffffffffffffb8));
  return this_00;
}

Assistant:

auto operator > ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { static_cast<bool>(m_lhs > rhs), m_lhs, ">", rhs };
        }